

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

int __thiscall
chrono::ChBezierCurveTracker::calcClosestPoint
          (ChBezierCurveTracker *this,ChVector<double> *loc,ChFrame<double> *tnb,double *curvature)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ChVector<double> result;
  ChVector<double> r;
  ChVector<double> rpp;
  ChVector<double> rp;
  undefined1 local_e8 [16];
  double local_d8;
  undefined1 local_c8 [16];
  ChVector<double> local_b8;
  ChVector<double> local_a0;
  ChVector<double> local_88;
  undefined1 local_70 [48];
  double local_40;
  double local_38;
  double local_30;
  undefined1 extraout_var [56];
  
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  iVar3 = calcClosestPoint(this,loc,&local_b8);
  ChBezierCurve::evalD
            (&local_88,*(ChBezierCurve **)this,*(size_t *)(this + 0x10),*(double *)(this + 0x18));
  ChBezierCurve::evalDD
            (&local_a0,*(ChBezierCurve **)this,*(size_t *)(this + 0x10),*(double *)(this + 0x18));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_88.m_data[0];
  auVar14._8_8_ = local_88.m_data[2];
  auVar14._0_8_ = local_88.m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_a0.m_data[0];
  auVar19._8_8_ = local_a0.m_data[2];
  auVar19._0_8_ = local_a0.m_data[2];
  auVar1._8_8_ = local_a0.m_data[2];
  auVar1._0_8_ = local_a0.m_data[1];
  auVar2._8_8_ = local_88.m_data[2];
  auVar2._0_8_ = local_88.m_data[1];
  auVar4 = vunpcklpd_avx(auVar14,auVar9);
  auVar6 = vunpcklpd_avx(auVar19,auVar6);
  auVar15._0_8_ = local_a0.m_data[1] * auVar4._0_8_;
  auVar15._8_8_ = local_a0.m_data[2] * auVar4._8_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_a0.m_data[0] * local_88.m_data[1];
  auVar4 = vfmsub231sd_fma(auVar7,auVar9,auVar1);
  local_e8 = vfmsub213pd_fma(auVar6,auVar2,auVar15);
  local_d8 = auVar4._0_8_;
  dVar5 = ChVector<double>::Length(&local_88);
  auVar8._0_8_ = ChVector<double>::Length((ChVector<double> *)local_e8);
  auVar8._8_56_ = extraout_var;
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  local_c8 = auVar8._0_16_;
  auVar4 = vandpd_avx512vl(local_c8,auVar4);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_88.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_88.m_data[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_88.m_data[2];
  local_40 = 1.0 / dVar5;
  local_70._0_8_ = local_40 * local_88.m_data[0];
  local_70._24_8_ = local_40 * local_88.m_data[1];
  local_40 = local_40 * local_88.m_data[2];
  if (auVar4._0_8_ <= 1e-06) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_40;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_70._24_8_;
    auVar6 = vfmsub213sd_fma(ZEXT816(0),auVar10,auVar32);
    local_70._8_8_ = auVar6._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (double)local_70._0_8_ * -0.0;
    auVar4 = vfmadd231sd_fma(auVar18,auVar32,ZEXT816(0));
    local_38 = auVar4._0_8_;
    dVar31 = (double)local_70._0_8_ + local_40 * -0.0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_70._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = (double)local_70._24_8_ * (double)local_70._8_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar31;
    auVar1 = vfmsub231sd_fma(auVar24,auVar11,auVar26);
    local_30 = auVar1._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar31 * local_40;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_70._24_8_;
    auVar4 = vfmsub231sd_fma(auVar22,auVar33,auVar4);
    local_70._16_8_ = auVar4._0_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_38 * (double)local_70._0_8_;
    auVar4 = vfmsub231sd_fma(auVar28,auVar10,auVar6);
    local_70._32_16_ = vunpcklpd_avx(auVar26,auVar4);
  }
  else {
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_d8;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_e8._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_e8._8_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_d8 * local_88.m_data[1];
    auVar6 = vfmsub231sd_fma(auVar29,auVar25,auVar20);
    auVar21._8_8_ = 0x3ff0000000000000;
    auVar21._0_8_ = 0x3ff0000000000000;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_88.m_data[2] * (double)local_e8._0_8_;
    auVar1 = vfmsub231sd_fma(auVar30,auVar27,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_88.m_data[0] * (double)local_e8._8_8_;
    auVar2 = vfmsub231sd_fma(auVar17,auVar23,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar5 * auVar8._0_8_;
    auVar4 = vunpcklpd_avx(auVar13,local_c8);
    auVar4 = vdivpd_avx(auVar21,auVar4);
    dVar31 = auVar4._0_8_;
    local_70._8_8_ = dVar31 * auVar6._0_8_;
    auVar6 = vshufpd_avx(auVar4,auVar4,1);
    local_38 = dVar31 * auVar2._0_8_;
    local_70._16_8_ = auVar6._0_8_ * (double)local_e8._0_8_;
    auVar1 = vunpcklpd_avx(auVar1,auVar25);
    local_70._32_8_ = dVar31 * auVar1._0_8_;
    local_70._40_8_ = auVar4._8_8_ * auVar1._8_8_;
    local_30 = auVar6._0_8_ * local_d8;
  }
  ChFrame<double>::SetRot(tnb,(ChMatrix33<double> *)local_70);
  (tnb->coord).pos.m_data[0] = local_b8.m_data[0];
  (tnb->coord).pos.m_data[1] = local_b8.m_data[1];
  (tnb->coord).pos.m_data[2] = local_b8.m_data[2];
  *curvature = (double)local_c8._0_8_ / (dVar5 * dVar5 * dVar5);
  return iVar3;
}

Assistant:

int ChBezierCurveTracker::calcClosestPoint(const ChVector<>& loc, ChFrame<>& tnb, double& curvature) {
    // Find closest point to specified location
    ChVector<> r;
    int flag = calcClosestPoint(loc, r);

    // Find 1st and 2nd order derivative vectors at the closest point
    ChVector<> rp = m_path->evalD(m_curInterval, m_curParam);
    ChVector<> rpp = m_path->evalDD(m_curInterval, m_curParam);

    // Calculate TNB frame
    ChVector<> rp_rpp = Vcross(rp, rpp);
    double rp_norm = rp.Length();
    double rp_rpp_norm = rp_rpp.Length();

    ChVector<> T = rp / rp_norm;
    ChVector<> N;
    ChVector<> B;
    if (std::abs(rp_rpp_norm) > 1e-6) {
        N = Vcross(rp_rpp, rp) / (rp_norm * rp_rpp_norm);
        B = rp_rpp / rp_rpp_norm;
    } else {  // Zero curvature
        B = ChVector<>(0, 0, 1);
        N = Vcross(B, T);
        B = Vcross(T, N);
    }

    ChMatrix33<> A(T, N, B);

    tnb.SetRot(A);
    tnb.SetPos(r);


    // Calculate curvature
    curvature = rp_rpp_norm / (rp_norm * rp_norm * rp_norm);

    return flag;
}